

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# funcargscontext_p.h
# Opt level: O2

void __thiscall
asmjit::FuncArgsContext::WorkData::reassign
          (WorkData *this,uint32_t varId,uint32_t newId,uint32_t oldId)

{
  bool bVar1;
  
  bVar1 = isAssigned(this,oldId);
  if (!bVar1) {
    DebugUtils::assertionFailed
              ("/workspace/llm4binary/github/license_c_cmakelists/comsec-group[P]blacksmith/build_O2/_deps/asmjit-src/src/asmjit/core/../core/funcargscontext_p.h"
               ,0x93,"isAssigned(oldId)");
  }
  bVar1 = isAssigned(this,newId);
  if (bVar1) {
    DebugUtils::assertionFailed
              ("/workspace/llm4binary/github/license_c_cmakelists/comsec-group[P]blacksmith/build_O2/_deps/asmjit-src/src/asmjit/core/../core/funcargscontext_p.h"
               ,0x94,"!isAssigned(newId)");
  }
  if (this->_physToVarId[oldId] != varId) {
    DebugUtils::assertionFailed
              ("/workspace/llm4binary/github/license_c_cmakelists/comsec-group[P]blacksmith/build_O2/_deps/asmjit-src/src/asmjit/core/../core/funcargscontext_p.h"
               ,0x95,"_physToVarId[oldId] == varId");
  }
  if (this->_physToVarId[newId] == 0xff) {
    this->_physToVarId[oldId] = 0xff;
    this->_physToVarId[newId] = (uint8_t)varId;
    this->_assignedRegs = this->_assignedRegs ^ 1 << ((byte)oldId & 0x1f) ^ 1 << (newId & 0x1f);
    return;
  }
  DebugUtils::assertionFailed
            ("/workspace/llm4binary/github/license_c_cmakelists/comsec-group[P]blacksmith/build_O2/_deps/asmjit-src/src/asmjit/core/../core/funcargscontext_p.h"
             ,0x96,"_physToVarId[newId] == kVarIdNone");
}

Assistant:

inline void reassign(uint32_t varId, uint32_t newId, uint32_t oldId) noexcept {
      ASMJIT_ASSERT( isAssigned(oldId));
      ASMJIT_ASSERT(!isAssigned(newId));
      ASMJIT_ASSERT(_physToVarId[oldId] == varId);
      ASMJIT_ASSERT(_physToVarId[newId] == kVarIdNone);

      _physToVarId[oldId] = uint8_t(kVarIdNone);
      _physToVarId[newId] = uint8_t(varId);
      _assignedRegs ^= Support::bitMask(newId) ^ Support::bitMask(oldId);
    }